

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_count_bits(mp_int *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  iVar1 = a->used;
  if ((long)iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (iVar1 + -1) * 0x3c;
    for (uVar3 = a->dp[(long)iVar1 + -1]; uVar3 != 0; uVar3 = uVar3 >> 1) {
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

int mp_count_bits (mp_int * a)
{
  int     r;
  mp_digit q;

  /* shortcut */
  if (a->used == 0) {
    return 0;
  }

  /* get number of digits and add that */
  r = (a->used - 1) * DIGIT_BIT;
  
  /* take the last digit and count the bits in it */
  q = a->dp[a->used - 1];
  while (q > ((mp_digit) 0)) {
    ++r;
    q >>= ((mp_digit) 1);
  }
  return r;
}